

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpTest.cpp
# Opt level: O3

void __thiscall THelp_NoHelp_Test::~THelp_NoHelp_Test(THelp_NoHelp_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(THelp, NoHelp) {
    CLI::App app{"My prog"};
    app.set_help_flag();

    std::string help = app.help();

    EXPECT_THAT(help, HasSubstr("My prog"));
    EXPECT_THAT(help, Not(HasSubstr("-h,--help")));
    EXPECT_THAT(help, Not(HasSubstr("Options:")));
    EXPECT_THAT(help, HasSubstr("Usage:"));

    std::vector<std::string> input{"--help"};
    try {
        app.parse(input);
    } catch(const CLI::ParseError &e) {
        EXPECT_EQ(static_cast<int>(CLI::ExitCodes::ExtrasError), e.get_exit_code());
    }
}